

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::RemoveRect(ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root)

{
  ON_RTreeNode *pOVar1;
  ON_RTreeListNode *pOVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 aVar3;
  ON_RTreeNode *pOVar4;
  bool bVar5;
  long lVar6;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar7;
  Blk *blk_1;
  ON_RTreeListNode *pOVar8;
  ON_RTreeListNode *local_38;
  
  local_38 = (ON_RTreeListNode *)0x0;
  bVar5 = RemoveRectRec(this,a_rect,a_id,*a_root,&local_38);
  pOVar8 = local_38;
  if (!bVar5) {
    while (pOVar8 != (ON_RTreeListNode *)0x0) {
      pOVar1 = pOVar8->m_node;
      pOVar4 = pOVar1;
      for (lVar6 = 0; paVar7 = &pOVar4->m_branch[0].field_1, lVar6 < pOVar1->m_count;
          lVar6 = lVar6 + 1) {
        InsertRect(this,&pOVar4->m_branch[0].m_rect,paVar7->m_id,a_root,pOVar1->m_level);
        pOVar4 = (ON_RTreeNode *)paVar7;
      }
      pOVar2 = pOVar8->m_next;
      pOVar1 = pOVar8->m_node;
      if (pOVar1 != (ON_RTreeNode *)0x0) {
        *(Blk **)&pOVar1->m_level = (this->m_mem_pool).m_nodes;
        (this->m_mem_pool).m_nodes = (Blk *)pOVar1;
      }
      pOVar8->m_next = (ON_RTreeListNode *)(this->m_mem_pool).m_list_nodes;
      (this->m_mem_pool).m_list_nodes = (Blk *)pOVar8;
      pOVar8 = pOVar2;
    }
    pOVar1 = *a_root;
    if ((pOVar1->m_count == 1) && (0 < pOVar1->m_level)) {
      aVar3 = pOVar1->m_branch[0].field_1;
      *(Blk **)pOVar1 = (this->m_mem_pool).m_nodes;
      (this->m_mem_pool).m_nodes = (Blk *)pOVar1;
      *a_root = (ON_RTreeNode *)aVar3;
    }
  }
  return bVar5;
}

Assistant:

bool ON_RTree::RemoveRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root)
{
  ON_RTreeNode* tempNode;
  ON_RTreeListNode* reInsertList = nullptr;

  if(!RemoveRectRec(a_rect, a_id, *a_root, &reInsertList))
  {
    // Found and deleted a data item
    // Reinsert any branches from eliminated nodes
    while(reInsertList)
    {
      tempNode = reInsertList->m_node;

      for(int index = 0; index < tempNode->m_count; ++index)
      {
        InsertRect(&(tempNode->m_branch[index].m_rect),
                   tempNode->m_branch[index].m_id,
                   a_root,
                   tempNode->m_level);
      }
      
      ON_RTreeListNode* remLNode = reInsertList;
      reInsertList = reInsertList->m_next;
      
      m_mem_pool.FreeNode(remLNode->m_node);
      m_mem_pool.FreeListNode(remLNode);
    }
    
    // Check for redundant root (not leaf, 1 child) and eliminate
    if((*a_root)->m_count == 1 && (*a_root)->IsInternalNode())
    {
      tempNode = (*a_root)->m_branch[0].m_child;
      m_mem_pool.FreeNode(*a_root);
      *a_root = tempNode;
    }
    return false;
  }
  else
  {
    return true;
  }
}